

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma.hpp
# Opt level: O0

void __thiscall Program::Program(Program *this)

{
  Program *this_local;
  
  AnalysisInterface::AnalysisInterface(&this->super_AnalysisInterface);
  (this->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0020da50;
  ConstantDeclaration::ConstantDeclaration(&this->m_constant_declaration);
  VariableDeclaration::VariableDeclaration(&this->m_variable_declaration);
  FunctionDefinition::FunctionDefinition(&this->m_function_definition);
  MainFunction::MainFunction(&this->m_main_function);
  return;
}

Assistant:

void LogOutput() {
        string str("This is a c0 program");
        g_log_tools->GrammaNormalLogs(str);
    }